

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

uint * Aig_ManSuppCharStart(Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  uint *p;
  int nWords;
  int Entry;
  int i;
  uint *pBuffer;
  int nPis_local;
  Vec_Int_t *vOne_local;
  
  iVar1 = Abc_BitWordNum(nPis);
  p = (uint *)malloc((long)iVar1 << 2);
  memset(p,0,(long)iVar1 << 2);
  nWords = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vOne);
    if (iVar1 <= nWords) {
      return p;
    }
    iVar1 = Vec_IntEntry(vOne,nWords);
    if (nPis <= iVar1) break;
    Abc_InfoSetBit(p,iVar1);
    nWords = nWords + 1;
  }
  __assert_fail("Entry < nPis",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,0x1df,"unsigned int *Aig_ManSuppCharStart(Vec_Int_t *, int)");
}

Assistant:

unsigned * Aig_ManSuppCharStart( Vec_Int_t * vOne, int nPis )
{
    unsigned * pBuffer;
    int i, Entry;
    int nWords = Abc_BitWordNum(nPis);
    pBuffer = ABC_ALLOC( unsigned, nWords );
    memset( pBuffer, 0, sizeof(unsigned) * nWords );
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
    return pBuffer;
}